

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdOpts.cpp
# Opt level: O2

int __thiscall CmdOpts::parse(CmdOpts *this)

{
  ArgHas AVar1;
  Option *pOVar2;
  char **ppcVar3;
  int *piVar4;
  int iVar5;
  undefined8 in_RAX;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  undefined8 *puVar10;
  int iVar11;
  undefined8 *puVar12;
  char *pcVar13;
  char acStack_40 [8];
  undefined8 uStack_38;
  
  iVar5 = this->_numOpts;
  lVar8 = (ulong)(iVar5 + 1) * -0x20;
  puVar12 = &uStack_38 + (ulong)(iVar5 + 1) * -4;
  pcVar13 = (char *)((long)puVar12 - ((ulong)(iVar5 * 3 + 1) + 0xf & 0xfffffffffffffff0));
  iVar11 = 0;
  pcVar6 = pcVar13;
  uStack_38 = in_RAX;
  while( true ) {
    uStack_38 = CONCAT44(iVar11,(undefined4)uStack_38);
    if (iVar5 <= iVar11) break;
    pOVar2 = this->_opts;
    *pOVar2[iVar11].present = false;
    *pcVar6 = pOVar2[iVar11].letter;
    pOVar2 = this->_opts;
    lVar9 = (long)(int)uStack_38._4_4_;
    puVar10 = puVar12 + lVar9 * 4 + 1;
    puVar12[lVar9 * 4] = pOVar2[lVar9].name;
    AVar1 = pOVar2[lVar9].arg.has;
    if (AVar1 == ArgOptional) {
      *(undefined4 *)puVar10 = 2;
      pcVar6[1] = ':';
      pcVar6[2] = ':';
      pcVar6 = pcVar6 + 3;
    }
    else if (AVar1 == ArgRequired) {
      *(undefined4 *)puVar10 = 1;
      pcVar6[1] = ':';
      pcVar6 = pcVar6 + 2;
    }
    else {
      pcVar6 = pcVar6 + 1;
      *(undefined4 *)puVar10 = 0;
    }
    iVar11 = uStack_38._4_4_ + 1;
    *(undefined8 *)(&stack0xffffffffffffffd8 + (long)(int)uStack_38._4_4_ * 0x20 + lVar8) = 0;
    *(undefined4 *)(&stack0xffffffffffffffe0 + (long)(int)uStack_38._4_4_ * 0x20 + lVar8) = 0;
    iVar5 = this->_numOpts;
  }
  *(undefined8 *)(&stack0xffffffffffffffd8 + (long)iVar5 * 0x20 + lVar8) = 0;
  *(undefined8 *)((long)(&stack0xffffffffffffffd8 + (long)iVar5 * 0x20 + lVar8) + 8) = 0;
  puVar12[(long)iVar5 * 4] = 0;
  (puVar12 + (long)iVar5 * 4)[1] = 0;
  *pcVar6 = '\0';
  uStack_38._4_4_ = 0;
  do {
    iVar5 = this->_argc;
    ppcVar3 = this->_argv;
    pcVar13[-8] = -0x36;
    pcVar13[-7] = -0x24;
    pcVar13[-6] = '\x10';
    pcVar13[-5] = '\0';
    pcVar13[-4] = '\0';
    pcVar13[-3] = '\0';
    pcVar13[-2] = '\0';
    pcVar13[-1] = '\0';
    iVar5 = getopt_long(iVar5,ppcVar3,pcVar13,puVar12,(long)&uStack_38 + 4);
    if (iVar5 != 0) {
      if (iVar5 == -1) {
        return _optind;
      }
      if (iVar5 == 0x3f) {
        pcVar13[-8] = -1;
        pcVar13[-7] = -1;
        pcVar13[-6] = -1;
        pcVar13[-5] = -1;
        pcVar13[-4] = -1;
        pcVar13[-3] = -1;
        pcVar13[-2] = -1;
        pcVar13[-1] = -1;
        return (int)*(undefined8 *)(pcVar13 + -8);
      }
      pcVar13[-8] = -0x15;
      pcVar13[-7] = -0x24;
      pcVar13[-6] = '\x10';
      pcVar13[-5] = '\0';
      pcVar13[-4] = '\0';
      pcVar13[-3] = '\0';
      pcVar13[-2] = '\0';
      pcVar13[-1] = '\0';
      uStack_38._4_4_ = find(this,(char)iVar5);
    }
    if (((int)uStack_38._4_4_ < 0) || (this->_numOpts <= (int)uStack_38._4_4_)) {
      pcVar13[-8] = -0x53;
      pcVar13[-7] = -0x23;
      pcVar13[-6] = '\x10';
      pcVar13[-5] = '\0';
      pcVar13[-4] = '\0';
      pcVar13[-3] = '\0';
      pcVar13[-2] = '\0';
      pcVar13[-1] = '\0';
      __assert_fail("optIdx >= 0 && optIdx < _numOpts",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Seeed-Studio[P]BOSSA/src/CmdOpts.cpp"
                    ,0x81,"int CmdOpts::parse()");
    }
    pOVar2 = this->_opts;
    uVar7 = (ulong)uStack_38._4_4_;
    *pOVar2[uVar7].present = true;
    if (_optarg != (char *)0x0 && pOVar2[uVar7].arg.has != ArgNone) {
      if (pOVar2[uVar7].arg.type == ArgInt) {
        pcVar13[-8] = 'Y';
        pcVar13[-7] = -0x23;
        pcVar13[-6] = '\x10';
        pcVar13[-5] = '\0';
        pcVar13[-4] = '\0';
        pcVar13[-3] = '\0';
        pcVar13[-2] = '\0';
        pcVar13[-1] = '\0';
        lVar8 = strtol(_optarg,(char **)0x0,0);
        *this->_opts[(int)uStack_38._4_4_].arg.value.intPtr = (int)lVar8;
      }
      else {
        piVar4 = pOVar2[uVar7].arg.value.intPtr;
        pcVar13[-8] = 'H';
        pcVar13[-7] = -0x23;
        pcVar13[-6] = '\x10';
        pcVar13[-5] = '\0';
        pcVar13[-4] = '\0';
        pcVar13[-3] = '\0';
        pcVar13[-2] = '\0';
        pcVar13[-1] = '\0';
        std::__cxx11::string::assign((char *)piVar4);
      }
    }
  } while( true );
}

Assistant:

int
CmdOpts::parse()
{
    struct option long_opts[_numOpts + 1];
    char optstring[_numOpts * 3 + 1];
    char* optPtr = optstring;
    int optIdx;
    int rc;

    for (optIdx = 0; optIdx < _numOpts; optIdx++)
    {
        *_opts[optIdx].present = false;

        *optPtr++ = _opts[optIdx].letter;
        long_opts[optIdx].name = _opts[optIdx].name;
        switch (_opts[optIdx].arg.has)
        {
        default:
        case ArgNone:
            long_opts[optIdx].has_arg = no_argument;
            break;
        case ArgOptional:
            long_opts[optIdx].has_arg = optional_argument;
            *optPtr++ = ':';
            *optPtr++ = ':';
            break;
        case ArgRequired:
            long_opts[optIdx].has_arg = required_argument;
            *optPtr++ = ':';
            break;
        }
        long_opts[optIdx].flag = NULL;
        long_opts[optIdx].val = 0;
    }

    memset(&long_opts[_numOpts], 0, sizeof(long_opts[_numOpts]));
    *optPtr = '\0';
    optIdx = 0;
    while ((rc = getopt_long(_argc, _argv, optstring, long_opts, &optIdx)) != -1)
    {
        if (rc == '?')
            return -1;

        if (rc != 0)
           optIdx = find(rc);

        assert(optIdx >= 0 && optIdx < _numOpts);
        *_opts[optIdx].present = true;
        if (_opts[optIdx].arg.has != ArgNone && optarg)
        {
            switch (_opts[optIdx].arg.type)
            {
            case ArgInt:
                *_opts[optIdx].arg.value.intPtr = strtol(optarg, NULL, 0);
                break;
            default:
            case ArgString:
                *_opts[optIdx].arg.value.strPtr = optarg;
                break;
            }
        }
    }

    return optind;
}